

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::dispose
          (Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *this)

{
  Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *pMVar1;
  size_t sVar2;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pMVar1,0x28,sVar2,sVar2,
               ArrayDisposer::
               Dispose_<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }